

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::SyncFd(PosixWritableFile *this,int fd,string *fd_path)

{
  undefined4 extraout_var;
  Status SVar1;
  
  SVar1.state_._0_4_ = fdatasync(fd);
  SVar1.state_._4_4_ = extraout_var;
  if ((int)SVar1.state_ != 0) {
    __errno_location();
    SVar1 = PosixError((string *)this,(int)(fd_path->_M_dataplus)._M_p);
    return (Status)SVar1.state_;
  }
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  return (Status)SVar1.state_;
}

Assistant:

static Status SyncFd(int fd, const std::string& fd_path) {
#if HAVE_FULLFSYNC
    // On macOS and iOS, fsync() doesn't guarantee durability past power
    // failures. fcntl(F_FULLFSYNC) is required for that purpose. Some
    // filesystems don't support fcntl(F_FULLFSYNC), and require a fallback to
    // fsync().
    if (::fcntl(fd, F_FULLFSYNC) == 0) {
      return Status::OK();
    }
#endif  // HAVE_FULLFSYNC

#if HAVE_FDATASYNC
    bool sync_success = ::fdatasync(fd) == 0;
#else
    bool sync_success = ::fsync(fd) == 0;
#endif  // HAVE_FDATASYNC

    if (sync_success) {
      return Status::OK();
    }
    return PosixError(fd_path, errno);
  }